

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImporterT.hh
# Opt level: O2

void __thiscall
OpenMesh::IO::ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_>::set_texcoord
          (ImporterT<OpenMesh::TriMesh_ArrayKernelT<MyTraits>_> *this,VertexHandle _vh,
          Vec2f *_texcoord)

{
  TexCoord2D local_18;
  
  if ((((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
       this->mesh_)->vertex_texcoords2D_).super_BasePropHandleT<OpenMesh::VectorT<double,_2>_>.
      super_BaseHandle.idx_ != -1) {
    local_18.super_VectorDataT<double,_2>.values_[0] =
         (double)(_texcoord->super_VectorDataT<float,_2>).values_[0];
    local_18.super_VectorDataT<double,_2>.values_[1] =
         (double)(_texcoord->super_VectorDataT<float,_2>).values_[1];
    AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
    set_texcoord2D((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                    *)this->mesh_,_vh,&local_18);
  }
  return;
}

Assistant:

virtual void set_texcoord(VertexHandle _vh, const Vec2f& _texcoord)
  {
    if (mesh_.has_vertex_texcoords2D())
      mesh_.set_texcoord2D(_vh, vector_cast<TexCoord2D>(_texcoord));
  }